

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit-interleave.cc
# Opt level: O0

void util_bits::DeinterleaveUint8(uint32 x,uint8 *a,uint8 *b,uint8 *c)

{
  uint8 uVar1;
  uint8 *c_local;
  uint8 *b_local;
  uint8 *a_local;
  uint32 x_local;
  
  uVar1 = UnsplitFor3(x);
  *a = uVar1;
  uVar1 = UnsplitFor3(x >> 1);
  *b = uVar1;
  uVar1 = UnsplitFor3(x >> 2);
  *c = uVar1;
  return;
}

Assistant:

void DeinterleaveUint8(uint32 x, uint8* a, uint8* b, uint8* c) {
  *a = UnsplitFor3(x);
  *b = UnsplitFor3(x >> 1);
  *c = UnsplitFor3(x >> 2);
}